

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O0

void Sfm_TimCriticalPath_int(Sfm_Tim_t *p,Abc_Obj_t *pObj,Vec_Int_t *vPath,int SlackMax)

{
  int iVar1;
  uint Entry;
  Abc_Obj_t *pObj_00;
  int local_34;
  int i;
  Abc_Obj_t *pNext;
  int SlackMax_local;
  Vec_Int_t *vPath_local;
  Abc_Obj_t *pObj_local;
  Sfm_Tim_t *p_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                    ,0xa0,"void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)"
                   );
    }
    for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_34 < iVar1; local_34 = local_34 + 1) {
      pObj_00 = Abc_ObjFanin(pObj,local_34);
      iVar1 = Abc_ObjIsCi(pObj_00);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 != 0)) {
        iVar1 = Abc_ObjIsNode(pObj_00);
        if (iVar1 == 0) {
          __assert_fail("Abc_ObjIsNode(pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmTim.c"
                        ,0xa5,
                        "void Sfm_TimCriticalPath_int(Sfm_Tim_t *, Abc_Obj_t *, Vec_Int_t *, int)");
        }
        iVar1 = Sfm_TimSlack(p,pObj_00);
        if (iVar1 <= SlackMax) {
          Sfm_TimCriticalPath_int(p,pObj_00,vPath,SlackMax);
        }
      }
    }
    iVar1 = Abc_ObjFaninNum(pObj);
    if (0 < iVar1) {
      Entry = Abc_ObjId(pObj);
      Vec_IntPush(vPath,Entry);
    }
  }
  return;
}

Assistant:

void Sfm_TimCriticalPath_int( Sfm_Tim_t * p, Abc_Obj_t * pObj, Vec_Int_t * vPath, int SlackMax )
{
    Abc_Obj_t * pNext; int i;
    if ( Abc_NodeIsTravIdCurrent( pObj ) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    assert( Abc_ObjIsNode(pObj) );
    Abc_ObjForEachFanin( pObj, pNext, i )
    {
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) == 0 )
            continue;
        assert( Abc_ObjIsNode(pNext) );
        if ( Sfm_TimSlack(p, pNext) <= SlackMax )
            Sfm_TimCriticalPath_int( p, pNext, vPath, SlackMax );
    }
    if ( Abc_ObjFaninNum(pObj) > 0 )
        Vec_IntPush( vPath, Abc_ObjId(pObj) );
}